

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcyclicityIndex.cpp
# Opt level: O2

void __thiscall
Indexing::AcyclicityIndex::CycleSearchIterator::CycleSearchIterator
          (CycleSearchIterator *this,Literal *queryLit,Clause *queryClause,AcyclicityIndex *aindex)

{
  uint uVar1;
  DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *k;
  TermList TVar2;
  RobSubstitution *this_00;
  DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  **ppDVar3;
  IndexEntry **ppIVar4;
  CycleSearchTreeNode *pCVar5;
  pair<Kernel::Literal_*,_Kernel::Clause_*> key;
  TypedTermList t;
  TermList sort;
  uint in_stack_ffffffffffffffa8;
  long local_50;
  TermList local_48;
  Literal *local_40;
  Clause *local_38;
  
  this->_queryLit = queryLit;
  this->_index = (SIndex *)0x0;
  this->_tis = (TermIndexingStructure *)0x0;
  this->_nextResult = (CycleQueryResult *)0x0;
  (this->_stack)._capacity = 0;
  (this->_stack)._stack = (CycleSearchTreeNode **)0x0;
  (this->_stack)._cursor = (CycleSearchTreeNode **)0x0;
  (this->_stack)._end = (CycleSearchTreeNode **)0x0;
  this_00 = (RobSubstitution *)Kernel::RobSubstitution::operator_new(200);
  Kernel::RobSubstitution::RobSubstitution(this_00);
  this->_subst = this_00;
  this->_nextAvailableIndex = 0;
  this->_currentDepth = 0;
  (this->_substChanges)._capacity = 0;
  (this->_substChanges)._stack = (BacktrackData *)0x0;
  (this->_substChanges)._cursor = (BacktrackData *)0x0;
  (this->_substChanges)._end = (BacktrackData *)0x0;
  if ((queryLit->super_Term)._functor == 0) {
    local_48 = Kernel::SortHelper::getEqualityArgumentSort(queryLit);
    Lib::
    DHMap<Kernel::TermList,_Lib::DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::find((DHMap<Kernel::TermList,_Lib::DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)&local_40,(TermList *)&aindex->_sIndexes);
    if (local_40 != (Literal *)0x0) {
      ppDVar3 = Lib::
                DHMap<Kernel::TermList,_Lib::DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::get(&aindex->_sIndexes,local_48);
      k = *ppDVar3;
      this->_index = k;
      this->_tis = aindex->_tis;
      local_40 = queryLit;
      local_38 = queryClause;
      Lib::
      DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::find((DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              *)&local_50,(pair<Kernel::Literal_*,_Kernel::Clause_*> *)k);
      if (local_50 != 0) {
        key.second = queryClause;
        key.first = queryLit;
        ppIVar4 = Lib::
                  DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                  ::get(this->_index,key);
        pCVar5 = (CycleSearchTreeNode *)((*ppIVar4)->t).super_TermList._content;
        TVar2._content = ((*ppIVar4)->t)._sort._content;
        uVar1 = this->_nextAvailableIndex;
        this->_nextAvailableIndex = uVar1 + 1;
        t._sort._content = (uint64_t)queryLit;
        t.super_TermList._content = TVar2._content;
        pCVar5 = CycleSearchTreeNode::unificationNode
                           (pCVar5,t,(Literal *)queryClause,(Clause *)0x0,
                            (CycleSearchTreeNode *)(ulong)uVar1,in_stack_ffffffffffffffa8);
        Lib::Stack<Indexing::AcyclicityIndex::CycleSearchTreeNode_*>::push(&this->_stack,pCVar5);
      }
    }
  }
  return;
}

Assistant:

CycleSearchIterator(Literal *queryLit,
                        Clause *queryClause,
                        AcyclicityIndex& aindex)
      :
      _queryLit(queryLit),
      _index(nullptr),
      _tis(nullptr),
      _nextResult(nullptr),
      _stack(0),
      _subst(new RobSubstitution()),
      _substChanges(0),
      _nextAvailableIndex(0),
      _currentDepth(0)
    {
      if (queryLit->isEquality()) {
        TermList sort = SortHelper::getEqualityArgumentSort(queryLit);

        if (aindex._sIndexes.find(sort)) {
          _index = aindex._sIndexes.get(sort);
          _tis = aindex._tis;
          if (_index->find(make_pair(queryLit, queryClause))) {
            IndexEntry *entry = _index->get(make_pair(queryLit, queryClause));
            _stack.push(CycleSearchTreeNode::unificationNode(entry->t,
                                                             queryLit,
                                                             queryClause,
                                                             nullptr,
                                                             _nextAvailableIndex++));
          }
        }
      }
      ASS_EQ(_currentDepth, _substChanges.size());
    }